

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

void __thiscall el::base::PErrorWriter::~PErrorWriter(PErrorWriter *this)

{
  stringstream_t *psVar1;
  ostream *poVar2;
  int *piVar3;
  char *pcVar4;
  undefined8 *in_RDI;
  Writer *in_stack_ffffffffffffffd0;
  
  *in_RDI = &PTR__PErrorWriter_002d4200;
  if ((*(byte *)(in_RDI + 7) & 1) != 0) {
    psVar1 = Logger::stream_abi_cxx11_((Logger *)in_RDI[6]);
    poVar2 = std::operator<<((ostream *)(psVar1 + 0x10),": ");
    piVar3 = __errno_location();
    pcVar4 = strerror(*piVar3);
    poVar2 = std::operator<<(poVar2,pcVar4);
    in_stack_ffffffffffffffd0 = (Writer *)std::operator<<(poVar2," [");
    piVar3 = __errno_location();
    poVar2 = (ostream *)std::ostream::operator<<(in_stack_ffffffffffffffd0,*piVar3);
    std::operator<<(poVar2,"]");
  }
  Writer::~Writer(in_stack_ffffffffffffffd0);
  return;
}

Assistant:

PErrorWriter::~PErrorWriter(void) {
  if (m_proceed) {
#if ELPP_COMPILER_MSVC
    char buff[256];
    strerror_s(buff, 256, errno);
    m_logger->stream() << ": " << buff << " [" << errno << "]";
#else
    m_logger->stream() << ": " << strerror(errno) << " [" << errno << "]";
#endif
  }
}